

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StockPileTests.cpp
# Opt level: O0

void __thiscall
solitaire::piles::StockPileWithCardsTest_tryPullOutFirstCard_Test::
~StockPileWithCardsTest_tryPullOutFirstCard_Test
          (StockPileWithCardsTest_tryPullOutFirstCard_Test *this)

{
  StockPileWithCardsTest_tryPullOutFirstCard_Test *this_local;
  
  ~StockPileWithCardsTest_tryPullOutFirstCard_Test(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST_F(StockPileWithCardsTest, tryPullOutFirstCard) {
    const auto firstCard = pileCards.front();
    pileCards.erase(pileCards.begin());

    pile->trySelectNextCard();

    EXPECT_EQ(pile->tryPullOutCard(), firstCard);
    EXPECT_THAT(pile->getCards(), ContainerEq(pileCards));
    EXPECT_EQ(pile->getSelectedCardIndex(), std::nullopt);
}